

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  BrotliEncoderDictionary *pBVar4;
  HasherCommon *pHVar5;
  uint8_t *puVar6;
  BrotliDictionary *pBVar7;
  bool bVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  uint32_t uVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  byte bVar17;
  ushort uVar18;
  ulong uVar19;
  ulong *puVar20;
  void *pvVar21;
  ulong *puVar22;
  ulong *puVar23;
  void *pvVar24;
  int iVar25;
  uint16_t uVar26;
  void *pvVar27;
  void *pvVar28;
  size_t sVar29;
  ulong uVar30;
  ushort uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  void *pvVar36;
  ulong *puVar37;
  void *pvVar38;
  ulong uVar39;
  void *pvVar40;
  ulong uVar41;
  int iVar42;
  char cVar43;
  ulong uVar44;
  void *pvVar45;
  ulong uVar46;
  void *pvVar47;
  ulong *puVar48;
  void *pvVar49;
  ulong uVar50;
  void *pvVar51;
  void *pvVar52;
  ulong uVar53;
  bool bVar54;
  int local_154;
  size_t local_148;
  ulong local_140;
  void *local_128;
  void *local_120;
  ulong local_118;
  void *local_f8;
  void *local_e8;
  Command *local_e0;
  ulong local_d8;
  uint local_b4;
  void *local_b0;
  ulong local_90;
  uint8_t *s1_orig_1;
  
  local_148 = *last_insert_len;
  uVar1 = position + num_bytes;
  pvVar13 = (void *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    pvVar13 = (void *)position;
  }
  lVar34 = 0x200;
  if (params->quality < 9) {
    lVar34 = 0x40;
  }
  if (position + 4 < uVar1) {
    pvVar27 = (void *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
    sVar2 = params->stream_offset;
    sVar3 = (params->dictionary).compound.total_size;
    local_b0 = (void *)(lVar34 + position);
    lVar14 = sVar3 + 1;
    local_e0 = commands;
    pvVar16 = (void *)position;
    do {
      pvVar45 = pvVar27;
      if (pvVar16 < pvVar27) {
        pvVar45 = pvVar16;
      }
      pvVar24 = (void *)(sVar2 + (long)pvVar16);
      if (pvVar27 <= (void *)(sVar2 + (long)pvVar16)) {
        pvVar24 = pvVar27;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_b4 = 0;
        local_90 = 0;
      }
      else {
        if (pvVar16 == (void *)0x0) {
          local_90 = 0;
        }
        else {
          local_90 = (ulong)ringbuffer[(long)pvVar16 - 1U & ringbuffer_mask];
        }
        if (pvVar16 < (void *)0x2) {
          uVar19 = 0;
        }
        else {
          uVar19 = (ulong)ringbuffer[(long)pvVar16 - 2U & ringbuffer_mask];
        }
        local_b4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar19 + 0x100] | literal_context_lut[local_90]];
      }
      local_128 = (void *)(uVar1 - (long)pvVar16);
      pBVar4 = (params->dictionary).contextual.dict[local_b4];
      pvVar52 = (void *)(params->dist).max_distance;
      pvVar49 = (hasher->privat)._H40.extra[0];
      pvVar51 = (hasher->privat)._H40.extra[1];
      uVar19 = (ulong)pvVar16 & ringbuffer_mask;
      puVar20 = (ulong *)(ringbuffer + uVar19);
      uVar11 = (uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0x11;
      local_118 = 0x7e4;
      pvVar47 = (void *)0x0;
      lVar15 = 0;
      local_f8 = (void *)0x0;
      local_120 = (void *)0x0;
      local_d8 = 0x7e4;
      do {
        pvVar28 = (void *)(long)dist_cache[lVar15];
        pvVar21 = (void *)((long)pvVar16 - (long)pvVar28);
        cVar43 = (char)uVar11;
        if ((((lVar15 == 0) ||
             (*(char *)((long)pvVar49 + ((ulong)pvVar21 & 0xffff) + 0x30000) == cVar43)) &&
            (pvVar28 <= pvVar45)) && (pvVar21 < pvVar16)) {
          puVar22 = (ulong *)(ringbuffer + ((ulong)pvVar21 & ringbuffer_mask));
          pvVar38 = local_128;
          puVar48 = puVar20;
          puVar23 = puVar22;
          for (pvVar21 = local_128; (void *)0x7 < pvVar21; pvVar21 = (void *)((long)pvVar21 - 8)) {
            uVar44 = *puVar48;
            uVar46 = *puVar23;
            if (uVar44 == uVar46) {
              puVar23 = puVar23 + 1;
            }
            else {
              uVar35 = 0;
              if ((uVar46 ^ uVar44) != 0) {
                for (; ((uVar46 ^ uVar44) >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              pvVar38 = (void *)((long)puVar23 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar22));
            }
            if (uVar44 != uVar46) goto LAB_003140f3;
            puVar48 = puVar48 + 1;
          }
          puVar37 = puVar23;
          if (pvVar21 != (void *)0x0) {
            puVar37 = (ulong *)((long)puVar23 + (long)pvVar21);
            pvVar38 = (void *)0x0;
            do {
              if (*(char *)((long)puVar23 + (long)pvVar38) !=
                  *(char *)((long)puVar48 + (long)pvVar38)) {
                puVar37 = (ulong *)((long)puVar23 + (long)pvVar38);
                break;
              }
              pvVar38 = (void *)((long)pvVar38 + 1);
            } while (pvVar21 != pvVar38);
          }
          pvVar38 = (void *)((long)puVar37 - (long)puVar22);
LAB_003140f3:
          if (((void *)0x1 < pvVar38) && (uVar44 = (long)pvVar38 * 0x87 + 0x78f, local_118 < uVar44)
             ) {
            if (lVar15 != 0) {
              uVar44 = uVar44 - ((0x1ca10U >> ((byte)lVar15 & 2) & 4) + 0x27);
            }
            if (local_118 < uVar44) {
              local_f8 = pvVar38;
              local_d8 = uVar44;
              pvVar47 = pvVar38;
              local_120 = pvVar28;
              local_118 = uVar44;
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      uVar35 = (ulong)uVar11;
      sVar29 = (hasher->privat)._H5.block_size_;
      uVar39 = (long)pvVar16 - (ulong)*(uint *)((long)pvVar49 + uVar35 * 4);
      uVar44 = (ulong)*(ushort *)((long)pvVar49 + uVar35 * 2 + 0x20000);
      pvVar21 = (void *)0x0;
      uVar46 = uVar39;
      do {
        bVar54 = sVar29 == 0;
        sVar29 = sVar29 - 1;
        if (bVar54) break;
        pvVar21 = (void *)((long)pvVar21 + uVar46);
        if (pvVar21 <= pvVar45) {
          uVar41 = (ulong)*(ushort *)((long)pvVar51 + uVar44 * 4 + 2);
          uVar46 = (ulong)*(ushort *)((long)pvVar51 + uVar44 * 4);
          uVar44 = uVar41;
          if (uVar19 + (long)pvVar47 <= ringbuffer_mask) {
            uVar53 = (long)pvVar16 - (long)pvVar21 & ringbuffer_mask;
            uVar41 = uVar53 + (long)pvVar47;
            if ((uVar41 <= ringbuffer_mask) &&
               (ringbuffer[uVar19 + (long)pvVar47] == ringbuffer[uVar41])) {
              puVar22 = (ulong *)(ringbuffer + uVar53);
              pvVar38 = local_128;
              puVar48 = puVar20;
              puVar23 = puVar22;
              for (pvVar28 = local_128; (void *)0x7 < pvVar28; pvVar28 = (void *)((long)pvVar28 - 8)
                  ) {
                uVar41 = *puVar48;
                uVar53 = *puVar23;
                if (uVar41 == uVar53) {
                  puVar23 = puVar23 + 1;
                }
                else {
                  uVar30 = 0;
                  if ((uVar53 ^ uVar41) != 0) {
                    for (; ((uVar53 ^ uVar41) >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  pvVar38 = (void *)((long)puVar23 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar22));
                }
                if (uVar41 != uVar53) goto LAB_003142b2;
                puVar48 = puVar48 + 1;
              }
              puVar37 = puVar23;
              if (pvVar28 != (void *)0x0) {
                puVar37 = (ulong *)((long)pvVar28 + (long)puVar23);
                pvVar38 = (void *)0x0;
                do {
                  if (*(char *)((long)puVar23 + (long)pvVar38) !=
                      *(char *)((long)puVar48 + (long)pvVar38)) {
                    puVar37 = (ulong *)((long)puVar23 + (long)pvVar38);
                    break;
                  }
                  pvVar38 = (void *)((long)pvVar38 + 1);
                } while (pvVar28 != pvVar38);
              }
              pvVar38 = (void *)((long)puVar37 - (long)puVar22);
LAB_003142b2:
              if ((void *)0x3 < pvVar38) {
                iVar25 = 0x1f;
                if ((uint)pvVar21 != 0) {
                  for (; (uint)pvVar21 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                  }
                }
                uVar41 = (ulong)(iVar25 * -0x1e + 0x780) + (long)pvVar38 * 0x87;
                if (local_118 < uVar41) {
                  local_f8 = pvVar38;
                  local_d8 = uVar41;
                  pvVar47 = pvVar38;
                  local_120 = pvVar21;
                  local_118 = uVar41;
                }
              }
            }
          }
        }
      } while (pvVar21 <= pvVar45);
      uVar31 = (hasher->privat)._H42.free_slot_idx[0];
      (hasher->privat)._H42.free_slot_idx[0] = uVar31 + 1;
      if (0xfffe < uVar39) {
        uVar39 = 0xffff;
      }
      *(char *)((long)pvVar49 + ((ulong)pvVar16 & 0xffff) + 0x30000) = cVar43;
      *(short *)((long)pvVar51 + (ulong)uVar31 * 4) = (short)uVar39;
      *(undefined2 *)((long)pvVar51 + (ulong)uVar31 * 4 + 2) =
           *(undefined2 *)((long)pvVar49 + uVar35 * 2 + 0x20000);
      *(int *)((long)pvVar49 + uVar35 * 4) = (int)pvVar16;
      *(ushort *)((long)pvVar49 + uVar35 * 2 + 0x20000) = uVar31;
      local_154 = 0;
      if ((local_d8 == 0x7e4) &&
         (pHVar5 = (hasher->privat)._H5.common_,
         pHVar5->dict_num_lookups >> 7 <= pHVar5->dict_num_matches)) {
        uVar19 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar6 = pBVar4->hash_table_lengths;
        sVar29 = pHVar5->dict_num_lookups;
        local_154 = 0;
        lVar15 = 0;
        do {
          sVar29 = sVar29 + 1;
          pHVar5->dict_num_lookups = sVar29;
          bVar17 = puVar6[uVar19];
          pvVar45 = (void *)(ulong)bVar17;
          if (pvVar45 != (void *)0x0) {
            bVar54 = true;
            if (pvVar45 <= local_128) {
              pBVar7 = pBVar4->words;
              puVar23 = (ulong *)(pBVar7->data +
                                 (ulong)pBVar7->offsets_by_length[(long)pvVar45] +
                                 (ulong)pBVar4->hash_table_words[uVar19] * (long)pvVar45);
              pvVar49 = pvVar45;
              pvVar51 = pvVar16;
              puVar48 = puVar20;
              if (7 < bVar17) {
                do {
                  uVar44 = *puVar23;
                  uVar46 = *puVar48;
                  if (uVar44 == uVar46) {
                    puVar48 = puVar48 + 1;
                  }
                  else {
                    uVar35 = 0;
                    if ((uVar46 ^ uVar44) != 0) {
                      for (; ((uVar46 ^ uVar44) >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    pvVar51 = (void *)((long)puVar48 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar20))
                    ;
                  }
                  if (uVar44 != uVar46) goto LAB_003144b2;
                  puVar23 = puVar23 + 1;
                  pvVar49 = (void *)((long)pvVar49 - 8);
                } while ((void *)0x7 < pvVar49);
              }
              puVar22 = puVar48;
              if (pvVar49 != (void *)0x0) {
                puVar22 = (ulong *)((long)puVar48 + (long)pvVar49);
                pvVar51 = (void *)0x0;
                do {
                  if (*(char *)((long)puVar48 + (long)pvVar51) !=
                      *(char *)((long)puVar23 + (long)pvVar51)) {
                    puVar22 = (ulong *)((long)puVar48 + (long)pvVar51);
                    break;
                  }
                  pvVar51 = (void *)((long)pvVar51 + 1);
                } while (pvVar49 != pvVar51);
              }
              pvVar51 = (void *)((long)puVar22 - (long)puVar20);
LAB_003144b2:
              if (((pvVar51 != (void *)0x0) &&
                  (pvVar45 < (void *)((ulong)pBVar4->cutoffTransformsCount + (long)pvVar51))) &&
                 (pvVar45 = (void *)((long)pvVar24 +
                                    ((ulong)((uint)(pBVar4->cutoffTransforms >>
                                                   ((char)((long)pvVar45 - (long)pvVar51) * '\x06' &
                                                   0x3fU)) & 0x3f) +
                                     ((long)pvVar45 - (long)pvVar51) * 4 <<
                                    (pBVar7->size_bits_by_length[(long)pvVar45] & 0x3f)) +
                                    (ulong)pBVar4->hash_table_words[uVar19] + lVar14),
                 pvVar45 <= pvVar52)) {
                iVar25 = 0x1f;
                if ((uint)pvVar45 != 0) {
                  for (; (uint)pvVar45 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                  }
                }
                uVar44 = ((long)pvVar51 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
                if (local_d8 <= uVar44) {
                  local_154 = (uint)bVar17 - (int)pvVar51;
                  bVar54 = false;
                  local_120 = pvVar45;
                  local_f8 = pvVar51;
                  local_d8 = uVar44;
                }
              }
            }
            if (!bVar54) {
              pHVar5->dict_num_matches = pHVar5->dict_num_matches + 1;
            }
          }
          uVar19 = uVar19 + 1;
          bVar54 = lVar15 == 0;
          lVar15 = lVar15 + 1;
        } while (bVar54);
      }
      if (local_d8 < 0x7e5) {
        local_148 = local_148 + 1;
        position = (long)pvVar16 + 1;
        if (local_b0 < position) {
          if (position <= (void *)((ulong)(uint)((int)lVar34 * 4) + (long)local_b0)) {
            pvVar45 = (void *)((long)pvVar16 + 9U);
            if ((void *)(uVar1 - 3) <= (void *)((long)pvVar16 + 9U)) {
              pvVar45 = (void *)(uVar1 - 3);
            }
            if (pvVar45 <= position) goto LAB_00315248;
            pvVar16 = (hasher->privat)._H40.extra[0];
            pvVar24 = (hasher->privat)._H40.extra[1];
            uVar31 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar11 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar19 = (ulong)uVar11;
              uVar44 = position - *(uint *)((long)pvVar16 + uVar19 * 4);
              *(char *)((long)pvVar16 + (position & 0xffff) + 0x30000) = (char)uVar11;
              if (0xfffe < uVar44) {
                uVar44 = 0xffff;
              }
              uVar18 = uVar31 + 1;
              *(short *)((long)pvVar24 + (ulong)uVar31 * 4) = (short)uVar44;
              *(undefined2 *)((long)pvVar24 + (ulong)uVar31 * 4 + 2) =
                   *(undefined2 *)((long)pvVar16 + uVar19 * 2 + 0x20000);
              *(int *)((long)pvVar16 + uVar19 * 4) = (int)position;
              *(ushort *)((long)pvVar16 + uVar19 * 2 + 0x20000) = uVar31;
              local_148 = local_148 + 2;
              position = position + 2;
              uVar31 = uVar18;
            } while (position < pvVar45);
            goto LAB_0031521d;
          }
          pvVar45 = (void *)((long)pvVar16 + 0x11U);
          if ((void *)(uVar1 - 4) <= (void *)((long)pvVar16 + 0x11U)) {
            pvVar45 = (void *)(uVar1 - 4);
          }
          if (position < pvVar45) {
            pvVar16 = (hasher->privat)._H40.extra[0];
            pvVar24 = (hasher->privat)._H40.extra[1];
            uVar31 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar11 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar19 = (ulong)uVar11;
              uVar44 = position - *(uint *)((long)pvVar16 + uVar19 * 4);
              *(char *)((long)pvVar16 + (position & 0xffff) + 0x30000) = (char)uVar11;
              if (0xfffe < uVar44) {
                uVar44 = 0xffff;
              }
              uVar18 = uVar31 + 1;
              *(short *)((long)pvVar24 + (ulong)uVar31 * 4) = (short)uVar44;
              *(undefined2 *)((long)pvVar24 + (ulong)uVar31 * 4 + 2) =
                   *(undefined2 *)((long)pvVar16 + uVar19 * 2 + 0x20000);
              *(int *)((long)pvVar16 + uVar19 * 4) = (int)position;
              *(ushort *)((long)pvVar16 + uVar19 * 2 + 0x20000) = uVar31;
              local_148 = local_148 + 4;
              position = position + 4;
              uVar31 = uVar18;
            } while (position < pvVar45);
            goto LAB_0031521d;
          }
        }
      }
      else {
        uVar31 = (hasher->privat)._H42.free_slot_idx[0];
        iVar25 = 0;
        do {
          local_128 = (void *)((long)local_128 - 1);
          pvVar45 = (void *)((long)local_f8 - 1U);
          if (local_128 <= (void *)((long)local_f8 - 1U)) {
            pvVar45 = local_128;
          }
          if (4 < params->quality) {
            pvVar45 = (void *)0x0;
          }
          pvVar24 = (void *)((long)pvVar16 + 1);
          pvVar52 = pvVar27;
          if (pvVar24 < pvVar27) {
            pvVar52 = pvVar24;
          }
          pvVar49 = (void *)((long)pvVar16 + sVar2 + 1);
          if (pvVar27 <= pvVar49) {
            pvVar49 = pvVar27;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_b4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_90 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)pvVar16 & ringbuffer_mask]]];
            local_90 = (ulong)ringbuffer[(ulong)pvVar16 & ringbuffer_mask];
          }
          pBVar4 = (params->dictionary).contextual.dict[local_b4];
          pvVar51 = (void *)(params->dist).max_distance;
          pvVar47 = (hasher->privat)._H40.extra[0];
          pvVar21 = (hasher->privat)._H40.extra[1];
          uVar44 = (ulong)pvVar24 & ringbuffer_mask;
          puVar20 = (ulong *)(ringbuffer + uVar44);
          uVar11 = (uint)(*(int *)(ringbuffer + uVar44) * 0x1e35a7bd) >> 0x11;
          local_140 = 0x7e4;
          lVar15 = 0;
          pvVar28 = (void *)0x0;
          local_e8 = (void *)0x0;
          uVar19 = 0x7e4;
          do {
            pvVar36 = (void *)(long)dist_cache[lVar15];
            pvVar38 = (void *)((long)pvVar24 - (long)pvVar36);
            cVar43 = (char)uVar11;
            if (((lVar15 == 0) ||
                (*(char *)((long)pvVar47 + ((ulong)pvVar38 & 0xffff) + 0x30000) == cVar43)) &&
               ((pvVar36 <= pvVar52 && (pvVar38 < pvVar24)))) {
              puVar22 = (ulong *)(ringbuffer + ((ulong)pvVar38 & ringbuffer_mask));
              pvVar40 = local_128;
              puVar48 = puVar20;
              puVar23 = puVar22;
              for (pvVar38 = local_128; (void *)0x7 < pvVar38; pvVar38 = (void *)((long)pvVar38 - 8)
                  ) {
                uVar46 = *puVar48;
                uVar35 = *puVar23;
                if (uVar46 == uVar35) {
                  puVar23 = puVar23 + 1;
                }
                else {
                  uVar39 = 0;
                  if ((uVar35 ^ uVar46) != 0) {
                    for (; ((uVar35 ^ uVar46) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  pvVar40 = (void *)((long)puVar23 + ((uVar39 >> 3 & 0x1fffffff) - (long)puVar22));
                }
                if (uVar46 != uVar35) goto LAB_003147b7;
                puVar48 = puVar48 + 1;
              }
              puVar37 = puVar23;
              if (pvVar38 != (void *)0x0) {
                puVar37 = (ulong *)((long)puVar23 + (long)pvVar38);
                pvVar40 = (void *)0x0;
                do {
                  if (*(char *)((long)puVar23 + (long)pvVar40) !=
                      *(char *)((long)puVar48 + (long)pvVar40)) {
                    puVar37 = (ulong *)((long)puVar23 + (long)pvVar40);
                    break;
                  }
                  pvVar40 = (void *)((long)pvVar40 + 1);
                } while (pvVar38 != pvVar40);
              }
              pvVar40 = (void *)((long)puVar37 - (long)puVar22);
LAB_003147b7:
              if (((void *)0x1 < pvVar40) &&
                 (uVar46 = (long)pvVar40 * 0x87 + 0x78f, local_140 < uVar46)) {
                if (lVar15 != 0) {
                  uVar46 = uVar46 - ((0x1ca10U >> ((byte)lVar15 & 2) & 4) + 0x27);
                }
                if (local_140 < uVar46) {
                  pvVar45 = pvVar40;
                  pvVar28 = pvVar40;
                  uVar19 = uVar46;
                  local_140 = uVar46;
                  local_e8 = pvVar36;
                }
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          uVar39 = (ulong)uVar11;
          sVar29 = (hasher->privat)._H5.block_size_;
          uVar41 = (long)pvVar24 - (ulong)*(uint *)((long)pvVar47 + uVar39 * 4);
          uVar35 = (ulong)*(ushort *)((long)pvVar47 + uVar39 * 2 + 0x20000);
          pvVar38 = (void *)0x0;
          uVar46 = uVar41;
          do {
            bVar54 = sVar29 == 0;
            sVar29 = sVar29 - 1;
            pvVar36 = pvVar28;
            if (bVar54) break;
            pvVar38 = (void *)((long)pvVar38 + uVar46);
            pvVar40 = pvVar45;
            uVar53 = uVar19;
            uVar30 = local_140;
            pvVar10 = local_e8;
            if (pvVar38 <= pvVar52) {
              uVar50 = (ulong)*(ushort *)((long)pvVar21 + uVar35 * 4 + 2);
              uVar46 = (ulong)*(ushort *)((long)pvVar21 + uVar35 * 4);
              uVar35 = uVar50;
              if (uVar44 + (long)pvVar45 <= ringbuffer_mask) {
                uVar30 = (long)pvVar24 - (long)pvVar38 & ringbuffer_mask;
                uVar53 = uVar30 + (long)pvVar45;
                if ((uVar53 <= ringbuffer_mask) &&
                   (ringbuffer[uVar44 + (long)pvVar45] == ringbuffer[uVar53])) {
                  puVar22 = (ulong *)(ringbuffer + uVar30);
                  pvVar36 = local_128;
                  puVar48 = puVar20;
                  puVar23 = puVar22;
                  for (pvVar40 = local_128; (void *)0x7 < pvVar40;
                      pvVar40 = (void *)((long)pvVar40 - 8)) {
                    uVar53 = *puVar48;
                    uVar30 = *puVar23;
                    if (uVar53 == uVar30) {
                      puVar23 = puVar23 + 1;
                    }
                    else {
                      uVar50 = 0;
                      if ((uVar30 ^ uVar53) != 0) {
                        for (; ((uVar30 ^ uVar53) >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                        }
                      }
                      pvVar36 = (void *)((long)puVar23 +
                                        ((uVar50 >> 3 & 0x1fffffff) - (long)puVar22));
                    }
                    if (uVar53 != uVar30) goto LAB_00314962;
                    puVar48 = puVar48 + 1;
                  }
                  puVar37 = puVar23;
                  if (pvVar40 != (void *)0x0) {
                    puVar37 = (ulong *)((long)puVar23 + (long)pvVar40);
                    pvVar36 = (void *)0x0;
                    do {
                      if (*(char *)((long)puVar23 + (long)pvVar36) !=
                          *(char *)((long)puVar48 + (long)pvVar36)) {
                        puVar37 = (ulong *)((long)puVar23 + (long)pvVar36);
                        break;
                      }
                      pvVar36 = (void *)((long)pvVar36 + 1);
                    } while (pvVar40 != pvVar36);
                  }
                  pvVar36 = (void *)((long)puVar37 - (long)puVar22);
LAB_00314962:
                  if ((void *)0x3 < pvVar36) {
                    iVar42 = 0x1f;
                    if ((uint)pvVar38 != 0) {
                      for (; (uint)pvVar38 >> iVar42 == 0; iVar42 = iVar42 + -1) {
                      }
                    }
                    uVar53 = (ulong)(iVar42 * -0x1e + 0x780) + (long)pvVar36 * 0x87;
                    pvVar40 = pvVar36;
                    uVar30 = uVar53;
                    pvVar10 = pvVar38;
                    if (local_140 < uVar53) goto LAB_003149af;
                  }
                }
                pvVar36 = pvVar28;
                pvVar40 = pvVar45;
                uVar53 = uVar19;
                uVar30 = local_140;
                pvVar10 = local_e8;
              }
            }
LAB_003149af:
            local_e8 = pvVar10;
            local_140 = uVar30;
            uVar19 = uVar53;
            pvVar45 = pvVar40;
            pvVar28 = pvVar36;
          } while (pvVar38 <= pvVar52);
          (hasher->privat)._H42.free_slot_idx[0] = uVar31 + 1;
          *(char *)((long)pvVar47 + ((ulong)pvVar24 & 0xffff) + 0x30000) = cVar43;
          if (0xfffe < uVar41) {
            uVar41 = 0xffff;
          }
          *(short *)((long)pvVar21 + (ulong)uVar31 * 4) = (short)uVar41;
          *(undefined2 *)((long)pvVar21 + (ulong)uVar31 * 4 + 2) =
               *(undefined2 *)((long)pvVar47 + uVar39 * 2 + 0x20000);
          *(int *)((long)pvVar47 + uVar39 * 4) = (int)pvVar24;
          *(ushort *)((long)pvVar47 + uVar39 * 2 + 0x20000) = uVar31;
          if (uVar19 == 0x7e4) {
            pHVar5 = (hasher->privat)._H5.common_;
            if (pHVar5->dict_num_matches < pHVar5->dict_num_lookups >> 7) {
              iVar42 = 0;
            }
            else {
              uVar44 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar6 = pBVar4->hash_table_lengths;
              sVar29 = pHVar5->dict_num_lookups;
              iVar42 = 0;
              lVar15 = 0;
              do {
                sVar29 = sVar29 + 1;
                pHVar5->dict_num_lookups = sVar29;
                bVar17 = puVar6[uVar44];
                pvVar45 = (void *)(ulong)bVar17;
                if (pvVar45 != (void *)0x0) {
                  bVar54 = true;
                  if (pvVar45 <= local_128) {
                    pBVar7 = pBVar4->words;
                    puVar23 = (ulong *)(pBVar7->data +
                                       (ulong)pBVar7->offsets_by_length[(long)pvVar45] +
                                       (ulong)pBVar4->hash_table_words[uVar44] * (long)pvVar45);
                    puVar48 = puVar20;
                    pvVar52 = pvVar45;
                    if (7 < bVar17) {
                      do {
                        uVar46 = *puVar23;
                        uVar35 = *puVar48;
                        if (uVar46 == uVar35) {
                          puVar48 = puVar48 + 1;
                        }
                        else {
                          uVar39 = 0;
                          if ((uVar35 ^ uVar46) != 0) {
                            for (; ((uVar35 ^ uVar46) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                            }
                          }
                          pvVar21 = (void *)((long)puVar48 +
                                            ((uVar39 >> 3 & 0x1fffffff) - (long)puVar20));
                        }
                        if (uVar46 != uVar35) goto LAB_00314bd5;
                        puVar23 = puVar23 + 1;
                        pvVar52 = (void *)((long)pvVar52 - 8);
                      } while ((void *)0x7 < pvVar52);
                    }
                    puVar22 = puVar48;
                    if (pvVar52 != (void *)0x0) {
                      puVar22 = (ulong *)((long)puVar48 + (long)pvVar52);
                      pvVar47 = (void *)0x0;
                      do {
                        if (*(char *)((long)puVar48 + (long)pvVar47) !=
                            *(char *)((long)puVar23 + (long)pvVar47)) {
                          puVar22 = (ulong *)((long)puVar48 + (long)pvVar47);
                          break;
                        }
                        pvVar47 = (void *)((long)pvVar47 + 1);
                      } while (pvVar52 != pvVar47);
                    }
                    pvVar21 = (void *)((long)puVar22 - (long)puVar20);
LAB_00314bd5:
                    bVar54 = true;
                    if (pvVar21 != (void *)0x0) {
                      if ((pvVar45 < (void *)((ulong)pBVar4->cutoffTransformsCount + (long)pvVar21))
                         && (pvVar45 = (void *)((long)pvVar49 +
                                               ((ulong)((uint)(pBVar4->cutoffTransforms >>
                                                              ((char)((long)pvVar45 - (long)pvVar21)
                                                               * '\x06' & 0x3fU)) & 0x3f) +
                                                ((long)pvVar45 - (long)pvVar21) * 4 <<
                                               (pBVar7->size_bits_by_length[(long)pvVar45] & 0x3f))
                                               + (ulong)pBVar4->hash_table_words[uVar44] + lVar14),
                            pvVar45 <= pvVar51)) {
                        iVar9 = 0x1f;
                        if ((uint)pvVar45 != 0) {
                          for (; (uint)pvVar45 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                          }
                        }
                        uVar46 = ((long)pvVar21 * 0x87 - (ulong)(uint)(iVar9 * 0x1e)) + 0x780;
                        bVar54 = true;
                        if (uVar19 <= uVar46) {
                          iVar42 = (uint)bVar17 - (int)pvVar21;
                          bVar54 = false;
                          pvVar36 = pvVar21;
                          uVar19 = uVar46;
                          local_e8 = pvVar45;
                        }
                      }
                      else {
                        bVar54 = true;
                      }
                    }
                  }
                  if (!bVar54) {
                    pHVar5->dict_num_matches = pHVar5->dict_num_matches + 1;
                  }
                }
                uVar44 = uVar44 + 1;
                bVar54 = lVar15 == 0;
                lVar15 = lVar15 + 1;
              } while (bVar54);
            }
          }
          else {
            iVar42 = 0;
          }
          bVar54 = local_d8 + 0xaf <= uVar19;
          local_b0 = pvVar16;
          iVar9 = iVar25;
          if (bVar54) {
            local_148 = local_148 + 1;
            local_120 = local_e8;
            local_b0 = pvVar24;
            local_154 = iVar42;
            local_f8 = pvVar36;
            local_d8 = uVar19;
            iVar9 = iVar25 + 1;
          }
          bVar8 = iVar25 < 3;
          uVar19 = (long)pvVar16 + 5;
          pvVar16 = local_b0;
          uVar31 = uVar31 + 1;
          iVar25 = iVar9;
        } while (bVar54 && (bVar8 && uVar19 < uVar1));
        pvVar16 = (void *)(sVar2 + (long)local_b0);
        if (pvVar27 <= (void *)(sVar2 + (long)local_b0)) {
          pvVar16 = pvVar27;
        }
        pvVar16 = (void *)((long)pvVar16 + sVar3);
        if (pvVar16 < local_120) {
LAB_00314f05:
          uVar19 = (long)local_120 + 0xf;
        }
        else {
          uVar11 = 0;
          bVar54 = false;
          if (local_120 != (void *)(long)*dist_cache) {
            if (local_120 == (void *)(long)dist_cache[1]) {
              uVar11 = 1;
            }
            else {
              uVar19 = (long)local_120 + (3 - (long)*dist_cache);
              if (uVar19 < 7) {
                bVar17 = (byte)((int)uVar19 << 2);
                uVar11 = 0x9750468;
              }
              else {
                uVar19 = (long)local_120 + (3 - (long)dist_cache[1]);
                if (6 < uVar19) {
                  if (local_120 != (void *)(long)dist_cache[2]) {
                    bVar54 = local_120 != (void *)(long)dist_cache[3];
                    uVar11 = 3;
                    goto LAB_00314efc;
                  }
                  uVar11 = 2;
                  goto LAB_00314efa;
                }
                bVar17 = (byte)((int)uVar19 << 2);
                uVar11 = 0xfdb1ace;
              }
              uVar11 = uVar11 >> (bVar17 & 0x1f) & 0xf;
            }
LAB_00314efa:
            bVar54 = false;
          }
LAB_00314efc:
          if (bVar54) goto LAB_00314f05;
          uVar19 = (ulong)uVar11;
        }
        if ((local_120 <= pvVar16) && (uVar19 != 0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)local_120;
        }
        uVar11 = (uint)local_148;
        local_e0->insert_len_ = uVar11;
        local_e0->copy_len_ = local_154 << 0x19 | (uint)local_f8;
        uVar46 = (ulong)(params->dist).num_direct_distance_codes;
        uVar44 = uVar46 + 0x10;
        if (uVar19 < uVar44) {
          local_e0->dist_prefix_ = (uint16_t)uVar19;
          uVar12 = 0;
        }
        else {
          uVar12 = (params->dist).distance_postfix_bits;
          bVar17 = (byte)uVar12;
          uVar19 = ((uVar19 - uVar46) + (4L << (bVar17 & 0x3f))) - 0x10;
          uVar32 = 0x1f;
          if ((uint)uVar19 != 0) {
            for (; (uint)uVar19 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
          bVar54 = (uVar19 >> ((ulong)uVar32 & 0x3f) & 1) != 0;
          iVar25 = uVar32 - uVar12;
          local_e0->dist_prefix_ =
               (short)((uint)bVar54 + iVar25 * 2 + 0xfffe << (bVar17 & 0x3f)) +
               (short)uVar44 + (~(ushort)(-1 << (bVar17 & 0x1f)) & (ushort)uVar19) |
               (short)iVar25 * 0x400;
          uVar12 = (uint32_t)
                   (uVar19 - ((ulong)bVar54 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar17 & 0x3f));
        }
        local_e0->dist_extra_ = uVar12;
        if (5 < local_148) {
          if (local_148 < 0x82) {
            uVar11 = 0x1f;
            uVar32 = (uint)(local_148 - 2);
            if (uVar32 != 0) {
              for (; uVar32 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar11 = (int)(local_148 - 2 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar11 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_148 < 0x842) {
            uVar32 = 0x1f;
            if (uVar11 - 0x42 != 0) {
              for (; uVar11 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
              }
            }
            uVar11 = (uVar32 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar11 = 0x15;
            if (0x1841 < local_148) {
              uVar11 = (uint)(ushort)(0x17 - (local_148 < 0x5842));
            }
          }
        }
        uVar32 = local_154 + (uint)local_f8;
        if (uVar32 < 10) {
          uVar33 = uVar32 - 2;
        }
        else if (uVar32 < 0x86) {
          uVar32 = uVar32 - 6;
          uVar33 = 0x1f;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar33 = (int)((ulong)(long)(int)uVar32 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar33 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar33 = 0x17;
          if (uVar32 < 0x846) {
            uVar33 = 0x1f;
            if (uVar32 - 0x46 != 0) {
              for (; uVar32 - 0x46 >> uVar33 == 0; uVar33 = uVar33 - 1) {
              }
            }
            uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
          }
        }
        uVar31 = (ushort)uVar33;
        uVar26 = (uVar31 & 7) + ((ushort)uVar11 & 7) * 8;
        if ((((local_e0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar11 < 8)) && (uVar31 < 0x10)) {
          if (7 < uVar31) {
            uVar26 = uVar26 + 0x40;
          }
        }
        else {
          iVar25 = ((uVar11 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3);
          uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar25 * 0x40 + 0x40;
        }
        local_e0->cmd_prefix_ = uVar26;
        *num_literals = *num_literals + local_148;
        position = (long)local_b0 + (long)local_f8;
        pvVar16 = pvVar13;
        if (position < pvVar13) {
          pvVar16 = (void *)position;
        }
        pvVar45 = (void *)((long)local_b0 + 2);
        if (local_120 < (void *)((ulong)local_f8 >> 2)) {
          pvVar24 = (void *)(position + (long)local_120 * -4);
          if (pvVar24 < pvVar45) {
            pvVar24 = pvVar45;
          }
          pvVar45 = pvVar24;
          if (pvVar16 < pvVar24) {
            pvVar45 = pvVar16;
          }
        }
        local_b0 = (void *)(lVar34 + (long)local_f8 * 2 + (long)local_b0);
        local_e0 = local_e0 + 1;
        if (pvVar45 < pvVar16) {
          pvVar24 = (hasher->privat)._H40.extra[0];
          pvVar52 = (hasher->privat)._H40.extra[1];
          uVar31 = (hasher->privat)._H42.free_slot_idx[0];
          do {
            uVar11 = (uint)(*(int *)(ringbuffer + ((ulong)pvVar45 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar19 = (ulong)uVar11;
            uVar44 = (long)pvVar45 - (ulong)*(uint *)((long)pvVar24 + uVar19 * 4);
            *(char *)((long)pvVar24 + ((ulong)pvVar45 & 0xffff) + 0x30000) = (char)uVar11;
            if (0xfffe < uVar44) {
              uVar44 = 0xffff;
            }
            uVar18 = uVar31 + 1;
            *(short *)((long)pvVar52 + (ulong)uVar31 * 4) = (short)uVar44;
            *(undefined2 *)((long)pvVar52 + (ulong)uVar31 * 4 + 2) =
                 *(undefined2 *)((long)pvVar24 + uVar19 * 2 + 0x20000);
            *(int *)((long)pvVar24 + uVar19 * 4) = (int)pvVar45;
            *(ushort *)((long)pvVar24 + uVar19 * 2 + 0x20000) = uVar31;
            pvVar45 = (void *)((long)pvVar45 + 1);
            uVar31 = uVar18;
          } while (pvVar16 != pvVar45);
          local_148 = 0;
LAB_0031521d:
          (hasher->privat)._H42.free_slot_idx[0] = uVar18;
        }
        else {
          local_148 = 0;
        }
      }
LAB_00315248:
      pvVar16 = (void *)position;
    } while (position + 4 < uVar1);
  }
  else {
    local_e0 = commands;
  }
  *last_insert_len = (local_148 + uVar1) - position;
  *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}